

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stp_bv_performance.cpp
# Opt level: O0

int main(void)

{
  undefined1 local_a0 [8];
  TestMaterial universe;
  
  universe._140_4_ = 0;
  TestMaterial::TestMaterial((TestMaterial *)local_a0,false);
  TestMaterial::initializeUniverse((TestMaterial *)local_a0);
  TestMaterial::TestAnimation((TestMaterial *)local_a0);
  universe._140_4_ = 0;
  TestMaterial::~TestMaterial((TestMaterial *)local_a0);
  return universe._140_4_;
}

Assistant:

int main()
{
#ifdef ENABLE_SIGFPE
  feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT);
#endif
  TestMaterial universe = TestMaterial(false); // No other objects than STP-BVs
  universe.initializeUniverse();
  universe.TestAnimation();
  return 0;
}